

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
IntegerInstance::receive
          (string *__return_storage_ptr__,IntegerInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  
  bVar1 = std::operator==(message_name,"get");
  if (bVar1) {
    op_get(__return_storage_ptr__,this,arguments);
  }
  else {
    bVar1 = std::operator==(message_name,"set:");
    if (bVar1) {
      op_set(__return_storage_ptr__,this,arguments);
    }
    else {
      bVar1 = std::operator==(message_name,"isEqualTo?");
      if (bVar1) {
        op_isEqualTo(__return_storage_ptr__,this,arguments);
      }
      else {
        bVar1 = std::operator==(message_name,"isLessThan?");
        if (bVar1) {
          op_isLessThan(__return_storage_ptr__,this,arguments);
        }
        else {
          bVar1 = std::operator==(message_name,"isLessThanOrEqualTo?");
          if (bVar1) {
            op_isLessThanOrEqualTo(__return_storage_ptr__,this,arguments);
          }
          else {
            bVar1 = std::operator==(message_name,"isGreaterThan?");
            if (bVar1) {
              op_isGreaterThan(__return_storage_ptr__,this,arguments);
            }
            else {
              bVar1 = std::operator==(message_name,"isGreaterThanOrEqualTo?");
              if (bVar1) {
                op_isGreaterThanOrEqualTo(__return_storage_ptr__,this,arguments);
              }
              else {
                bVar1 = std::operator==(message_name,"add:");
                if (bVar1) {
                  op_add(__return_storage_ptr__,this,arguments);
                }
                else {
                  bVar1 = std::operator==(message_name,"subtract:");
                  if (bVar1) {
                    op_subtract(__return_storage_ptr__,this,arguments);
                  }
                  else {
                    bVar1 = std::operator==(message_name,"multiplyBy:");
                    if (bVar1) {
                      op_multiplyBy(__return_storage_ptr__,this,arguments);
                    }
                    else {
                      bVar1 = std::operator==(message_name,"divideBy:");
                      if (!bVar1) {
                        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar2 = "RuntimeError: invalid message.";
                        __cxa_throw(puVar2,&char_const*::typeinfo,0);
                      }
                      op_divideBy(__return_storage_ptr__,this,arguments);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "set:")
        return op_set(arguments);
    if (message_name == "isEqualTo?")
        return op_isEqualTo(arguments);
    if (message_name == "isLessThan?")
        return op_isLessThan(arguments);
    if (message_name == "isLessThanOrEqualTo?")
        return op_isLessThanOrEqualTo(arguments);
    if (message_name == "isGreaterThan?")
        return op_isGreaterThan(arguments);
    if (message_name == "isGreaterThanOrEqualTo?")
        return op_isGreaterThanOrEqualTo(arguments);
    if (message_name == "add:")
        return op_add(arguments);
    if (message_name == "subtract:")
        return op_subtract(arguments);
    if (message_name == "multiplyBy:")
        return op_multiplyBy(arguments);
    if (message_name == "divideBy:")
        return op_divideBy(arguments);
    throw EXC_INVALID_MESSAGE;
}